

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined8 extraout_XMM0_Qa;
  __m128i *v_round_offset;
  undefined1 auVar2 [16];
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i m1;
  __m128i m0;
  __m128i m;
  int j;
  int i;
  __m128i v_maxval;
  __m128i *in_stack_00000350;
  int in_stack_00000358;
  undefined4 local_a0;
  undefined4 local_9c;
  __m128i *m1_00;
  __m128i *m0_00;
  CONV_BUF_TYPE *in_stack_ffffffffffffffe8;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  
  uVar10 = 0x40;
  uVar9 = 0x40;
  uVar8 = 0x40;
  uVar7 = 0x40;
  uVar6 = 0x40;
  uVar5 = 0x40;
  uVar4 = 0x40;
  uVar3 = 0x40;
  m1_00 = (__m128i *)0x40004000400040;
  m0_00 = (__m128i *)0x40004000400040;
  for (local_9c = 0; local_9c < in_stack_00000018; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < (int)m1[0]; local_a0 = local_a0 + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_a0));
      auVar1._8_8_ = v_round_offset;
      auVar1._0_8_ = extraout_XMM0_Qa;
      pmovzxbw(auVar1,extraout_XMM0_Qa);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = v_round_offset;
      pmovzxbw(auVar2,v_round_offset);
      blend_a64_d16_mask_w16_sse41
                ((uint8_t *)CONCAT26(uVar10,CONCAT24(uVar9,CONCAT22(uVar8,uVar7))),
                 (CONV_BUF_TYPE *)CONCAT26(uVar6,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))),
                 in_stack_ffffffffffffffe8,m0_00,m1_00,v_round_offset,in_stack_00000350,
                 in_stack_00000358);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)in_stack_00000010;
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 16) {
      const __m128i m = xx_loadu_128(mask + j);
      const __m128i m0 = _mm_cvtepu8_epi16(m);
      const __m128i m1 = _mm_cvtepu8_epi16(_mm_srli_si128(m, 8));

      blend_a64_d16_mask_w16_sse41(dst + j, src0 + j, src1 + j, &m0, &m1,
                                   round_offset, &v_maxval, shift);
    }
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}